

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall FlowGraph::Dump(FlowGraph *this)

{
  BasicBlock *this_00;
  SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppBVar5;
  Loop *pLVar6;
  undefined1 local_40 [8];
  Iterator __iter;
  
  Output::Print(L"\nFlowGraph\n");
  for (this_00 = this->blockList; this_00 != (BasicBlock *)0x0; this_00 = this_00->next) {
    if ((this_00->field_0x18 & 1) == 0) {
      for (pLVar6 = this_00->loop; pLVar6 != (Loop *)0x0; pLVar6 = pLVar6->parent) {
        Output::Print(L"    ");
      }
      BasicBlock::DumpHeader(this_00,false);
    }
  }
  Output::Print(L"\nLoopGraph\n");
  pLVar6 = this->loopList;
  if (pLVar6 != (Loop *)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      Output::Print(L"\nLoop\n");
      local_40 = (undefined1  [8])&pLVar6->blockList;
      __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
      while( true ) {
        if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        pSVar1 = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        __iter.list = (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        if ((undefined1  [8])pSVar1 == local_40) break;
        __iter.list = pSVar1;
        ppBVar5 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_40);
        if (((*ppBVar5)->field_0x18 & 1) == 0) {
          BasicBlock::DumpHeader(*ppBVar5,false);
        }
      }
      Output::Print(L"Loop  Ends\n");
      pLVar6 = pLVar6->next;
    } while (pLVar6 != (Loop *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::Dump()
{
    Output::Print(_u("\nFlowGraph\n"));
    FOREACH_BLOCK(block, this)
    {
        Loop * loop = block->loop;
        while (loop)
        {
            Output::Print(_u("    "));
            loop = loop->parent;
        }
        block->DumpHeader(false);
    } NEXT_BLOCK;

    Output::Print(_u("\nLoopGraph\n"));

    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        Output::Print(_u("\nLoop\n"));
        FOREACH_BLOCK_IN_LOOP(block, loop)
        {
            block->DumpHeader(false);
        }NEXT_BLOCK_IN_LOOP;
        Output::Print(_u("Loop  Ends\n"));
    }
}